

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O1

string * ws::wx_sha1(string *__return_storage_ptr__,string *str)

{
  uchar *puVar1;
  runtime_error *this;
  int i;
  long lVar2;
  char tmp [8];
  uchar out [20];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char local_50 [32];
  
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[10] = '\0';
  local_50[0xb] = '\0';
  local_50[0xc] = '\0';
  local_50[0xd] = '\0';
  local_50[0xe] = '\0';
  local_50[0xf] = '\0';
  local_50[0x10] = '\0';
  local_50[0x11] = '\0';
  local_50[0x12] = '\0';
  local_50[0x13] = '\0';
  local_50[0x14] = '\0';
  local_50[0x15] = '\0';
  local_50[0x16] = '\0';
  local_50[0x17] = '\0';
  local_50[0x18] = '\0';
  local_50[0x19] = '\0';
  local_50[0x1a] = '\0';
  local_50[0x1b] = '\0';
  puVar1 = SHA1((uchar *)(str->_M_dataplus)._M_p,str->_M_string_length,(uchar *)(local_50 + 8));
  if (puVar1 != (uchar *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_50[0] = '\0';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    lVar2 = 0;
    do {
      snprintf(local_50,8,"%02x",(ulong)(byte)local_50[lVar2 + 8]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,local_50);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x14);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x18);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sha1 error","");
  std::runtime_error::runtime_error(this,(string *)local_70);
  *(undefined ***)this = &PTR__runtime_error_0019fd30;
  *(undefined ***)(this + 0x10) = &PTR_s__workspace_llm4binary_github_lic_0019f120;
  __cxa_throw(this,&MsgCryptoError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string wx_sha1(const std::string &str)
  {
    unsigned char out[SHA_DIGEST_LENGTH] = {0};
    if (SHA1((const unsigned char *) str.c_str(), str.size(), out) == nullptr)
    {
      throw MsgCryptoError("sha1 error");
    }
    
    std::string ret;
    char tmp[8] = {0};
    for (int i = 0; i < SHA_DIGEST_LENGTH; i++)
    {
      snprintf(tmp, sizeof(tmp), "%02x", 0xff & out[i]);
      ret.append(tmp);
    }
    return ret;
  }